

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_ptr_instance.hpp
# Opt level: O0

pointer_holder<std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>,_DigitalConsumer_python>
* boost::python::objects::
  make_ptr_instance<DigitalConsumer_python,boost::python::objects::pointer_holder<std::unique_ptr<DigitalConsumer_python,std::default_delete<DigitalConsumer_python>>,DigitalConsumer_python>>
  ::construct<std::unique_ptr<DigitalConsumer_python,std::default_delete<DigitalConsumer_python>>>
            (void *storage,PyObject *param_2,
            unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_> *x)

{
  pointer_holder<std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>,_DigitalConsumer_python>
  *in_RDI;
  unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>
  *in_stack_ffffffffffffffb8;
  unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_> *p;
  pointer_holder<std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>,_DigitalConsumer_python>
  *in_stack_ffffffffffffffd0;
  unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_> local_20 [4];
  
  p = local_20;
  std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>::unique_ptr
            ((unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_> *)
             in_RDI,in_stack_ffffffffffffffb8);
  pointer_holder<std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>,_DigitalConsumer_python>
  ::pointer_holder(in_stack_ffffffffffffffd0,p);
  std::unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_>::~unique_ptr
            ((unique_ptr<DigitalConsumer_python,_std::default_delete<DigitalConsumer_python>_> *)
             in_RDI);
  return in_RDI;
}

Assistant:

static inline Holder* construct(void* storage, PyObject*, Arg& x)
    {
#if __cplusplus < 201103L
      return new (storage) Holder(x);
#else
      return new (storage) Holder(std::move(x));
#endif
    }